

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O1

void __thiscall ast::FunctionLiteral::~FunctionLiteral(FunctionLiteral *this)

{
  pointer ppIVar1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer ppIVar4;
  
  (this->super_Expr).super_Node._vptr_Node = (_func_int **)&PTR__FunctionLiteral_00125708;
  if (this->header != (Identifier *)0x0) {
    (*(this->header->super_Expr).super_Node._vptr_Node[1])();
  }
  this->header = (Identifier *)0x0;
  ppIVar1 = (this->parameters).
            super__Vector_base<ast::Identifier_*,_std::allocator<ast::Identifier_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppIVar4 = (this->parameters).
                 super__Vector_base<ast::Identifier_*,_std::allocator<ast::Identifier_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppIVar4 != ppIVar1; ppIVar4 = ppIVar4 + 1) {
    if (*ppIVar4 != (Identifier *)0x0) {
      (*((*ppIVar4)->super_Expr).super_Node._vptr_Node[1])();
    }
  }
  ppIVar4 = (this->parameters).
            super__Vector_base<ast::Identifier_*,_std::allocator<ast::Identifier_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->parameters).super__Vector_base<ast::Identifier_*,_std::allocator<ast::Identifier_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppIVar4) {
    (this->parameters).super__Vector_base<ast::Identifier_*,_std::allocator<ast::Identifier_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppIVar4;
  }
  if (this->body != (BlockStmt *)0x0) {
    (*(this->body->super_Stmt).super_Node._vptr_Node[1])();
  }
  this->body = (BlockStmt *)0x0;
  ppIVar4 = (this->parameters).
            super__Vector_base<ast::Identifier_*,_std::allocator<ast::Identifier_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppIVar4 != (pointer)0x0) {
    operator_delete(ppIVar4,(long)(this->parameters).
                                  super__Vector_base<ast::Identifier_*,_std::allocator<ast::Identifier_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppIVar4
                   );
  }
  (this->tok)._vptr_Token = (_func_int **)&PTR__Token_001258b0;
  pcVar2 = (this->tok).Literal._M_dataplus._M_p;
  paVar3 = &(this->tok).Literal.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

~FunctionLiteral(){
        delete  header;
        header = nullptr;
        for(auto param: parameters){
            delete  param;
            param = nullptr;
        }
        parameters.clear();
        delete body;
        body = nullptr;
    }